

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statamain.cpp
# Opt level: O3

ST_retcode stata_call(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  uint dim;
  uint uVar4;
  ST_int SVar5;
  undefined8 *puVar6;
  ST_retcode SVar7;
  uint uVar8;
  uint uVar9;
  VectorXd v;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  star;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  vertices;
  vector<int,_std::allocator<int>_> edges;
  value_type local_98;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_88;
  char *local_70;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_68;
  vector<int,_std::allocator<int>_> local_48;
  
  if (argc == 2) {
    pcVar1 = *argv;
    pcVar2 = argv[1];
    local_88.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dim = (*_stata_->colsof)(pcVar1);
    uVar4 = (*_stata_->rowsof)(pcVar1);
    if (dim == 0 || uVar4 == 0) {
      SVar7 = 0xc6;
      myprintf("Invalid rows/columns\n");
    }
    else {
      local_70 = pcVar2;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)malloc((ulong)dim * 8);
      if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          == (double *)0x0) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = operator_delete;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      uVar8 = 1;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
           (ulong)dim;
      do {
        uVar9 = 1;
        do {
          SVar5 = (*_stata_->safematel)(pcVar1,uVar8,uVar9,(ST_double *)&local_68);
          if (SVar5 != 0) {
            myprintf("Error while reading value at [%d,%d]\n",(ulong)uVar8,(ulong)uVar9);
            SVar7 = 0xc6;
            goto LAB_00105b49;
          }
          if (local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows <= (long)(ulong)(uVar9 - 1)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zonotopes[P]zono_cpp/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x17a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [uVar9 - 1] = (double)local_68.
                                super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = uVar9 + 1;
        } while (uVar9 <= dim);
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::push_back(&local_88,&local_98);
        uVar8 = uVar8 + 1;
      } while (uVar8 <= uVar4);
      local_68.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      dVar3 = zonotope_volume(&local_88,&local_68,&local_48,dim);
      SVar5 = (*_stata_->scalsave)(local_70,dVar3);
      if (SVar5 == 0) {
        SVar7 = 0;
      }
      else {
        SVar7 = 0xc6;
        myprintf("Unable to save result\n");
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::~vector(&local_68);
LAB_00105b49:
      free(local_98.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector(&local_88);
  }
  else {
    myprintf("Invalid arguments\n");
    SVar7 = 0xc6;
  }
  return SVar7;
}

Assistant:

STDLL stata_call(int argc, char *argv[])
{
	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_BEGIN\n");

	if (argc != 2)
	{
		myprintf("Invalid arguments\n");
		return 198;
	}

	char *mat = argv[0];
	char *scal = argv[1];

	std::vector<Eigen::VectorXd> star;

	unsigned int cols = SF_col(mat);
	unsigned int rows = SF_row(mat);

	if (!((cols > 0) && (rows > 0)))
	{
		myprintf("Invalid rows/columns\n");
		return 198;
	}

	Eigen::VectorXd v(cols);
	for (unsigned int i = 1; i <= rows; i++)
	{
		for (unsigned int j = 1; j <= cols; j++ )
		{
			ST_double z;
			if (SF_mat_el(mat, i, j, &z))
			{
				myprintf("Error while reading value at [%d,%d]\n", i, j);
				return 198;
			}
			v[j - 1] = z;
		}
		star.push_back(v);
	}

	std::vector<Eigen::VectorXd> vertices;
	std::vector<int> edges;

	double volume = zonotope_volume(star, vertices, edges, cols);

	if (SF_scal_save(scal, volume))
	{
		myprintf("Unable to save result\n");
		return 198;
	}

	dbgprintf("\nSTATA_ZONOTOPE_PLUGIN_END\n");
	return 0;
}